

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O2

string * __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::variable_info_abi_cxx11_
          (string *__return_storage_ptr__,canvas_factory<(linux_util::screen_t)0> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  device::xioctl(&this->super_device,0x4600,&this->vinfo);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"\nxres\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nyres\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nxres_virtual\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nyres_virtual\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nxoffset\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nyoffset\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nbits_per_pixel\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nr shift\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\ng shift\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nb shift\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nt shift\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\ngrayscale\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nnonstd\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nactivate\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nheight\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"mm");
  poVar1 = std::operator<<(poVar1,"\nwidth\t\t");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"mm\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string variable_info()  {
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // acquire variable info
            std::stringstream ss;
            ss  << "\nxres\t\t" << vinfo.xres           // visible resolution
                << "\nyres\t\t" << vinfo.yres
                << "\nxres_virtual\t" << vinfo.xres_virtual // virtual resolution
                << "\nyres_virtual\t" << vinfo.yres_virtual
                << "\nxoffset\t\t" << vinfo.xoffset     // offsets from virtual to visible resolution
                << "\nyoffset\t\t" << vinfo.yoffset
                << "\nbits_per_pixel\t" << vinfo.bits_per_pixel
                << "\nr shift\t\t" << vinfo.red.offset
                << "\ng shift\t\t" << vinfo.green.offset
                << "\nb shift\t\t" << vinfo.blue.offset
                << "\nt shift\t\t" << vinfo.transp.offset
                << "\ngrayscale\t" << vinfo.grayscale   // 0 = color, 1 = grayscale, >1 = FOURCC
                << "\nnonstd\t\t" << vinfo.nonstd       // != 0 non standard pixel format
                << "\nactivate\t" << vinfo.activate     // e.g FB_ACTIVATE_NOW set values immediately (or vbl), FB_ACTIVATE_FORCE force apply even when no change
                << "\nheight\t\t" << vinfo.height << "mm"   // height of picture in mm
                << "\nwidth\t\t" << vinfo.width << "mm\n";  // width of picture in mm
            return ss.str();
        }